

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m2v.c
# Opt level: O0

void m2v_swap_rows(m2v *M,int r1,int r2)

{
  m2v_base mVar1;
  int iVar2;
  int iVar3;
  int in_EDX;
  int in_ESI;
  m2v *in_RDI;
  m2v_base sw;
  int i;
  int o2;
  int o1;
  int local_1c;
  
  iVar2 = m2v__get_word(in_RDI,in_ESI,0);
  iVar3 = m2v__get_word(in_RDI,in_EDX,0);
  for (local_1c = 0; local_1c < in_RDI->row_stride; local_1c = local_1c + 1) {
    mVar1 = in_RDI->e[iVar2 + local_1c];
    in_RDI->e[iVar2 + local_1c] = in_RDI->e[iVar3 + local_1c];
    in_RDI->e[iVar3 + local_1c] = mVar1;
  }
  return;
}

Assistant:

void m2v_swap_rows(m2v* M, int r1, int r2)
{
	assert(0 <= r1 && r1 < M->n_row);
	assert(0 <= r2 && r2 < M->n_row);

	const int o1 = get_word(M, r1, 0);
	const int o2 = get_word(M, r2, 0);
	for (int i = 0; i < M->row_stride; ++i) {
		const m2v_base sw = M->e[o1 + i];
		M->e[o1 + i] = M->e[o2 + i];
		M->e[o2 + i] = sw;
	}
}